

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.hpp
# Opt level: O3

int32_t __thiscall
poincare_disc::
Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getLine(Dictionary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ifstream *ifs,vector<int,_std::allocator<int>_> *words)

{
  pointer piVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  size_t *psVar5;
  int iVar6;
  iterator __position;
  string token;
  int local_54;
  key_type local_50;
  
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar6 = 0;
  do {
    bVar3 = readWord(this,ifs,&local_50);
    _Var2._M_p = local_50._M_dataplus._M_p;
    if ((!bVar3) ||
       ((local_50._M_string_length == DAT_00112250 &&
        ((local_50._M_string_length == 0 ||
         (iVar4 = bcmp(local_50._M_dataplus._M_p,EOS_abi_cxx11_,local_50._M_string_length),
         iVar4 == 0)))))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50.field_2) {
        operator_delete(_Var2._M_p);
      }
      return iVar6;
    }
    psVar5 = get_hash(this,&local_50);
    if (psVar5 == (size_t *)0x0) {
      psVar5 = get_hash(this,(key_type *)UNK_abi_cxx11_);
      local_54 = (int)*psVar5;
      __position._M_current =
           (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current !=
          (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_0010bf36;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(words,__position,&local_54);
    }
    else {
      local_54 = (int)*psVar5;
      __position._M_current =
           (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(words,__position,&local_54);
      }
      else {
LAB_0010bf36:
        *__position._M_current = local_54;
        (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

const int32_t getLine(std::ifstream& ifs, std::vector<int32_t>& words) {
        std::uniform_real_distribution<> uniform(0, 1);

        words.clear();
        int32_t ntokens = 0;
        std::string token;
        while (this->readWord(ifs, token) && token != EOS) {
            size_t* wid = get_hash(token);
            ntokens++;
            if(wid) {
                words.push_back(*wid);       
            } else {
                wid = get_hash(UNK);
                words.push_back(*wid);       
            }
        }
        return ntokens;
    }